

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::process_mcu_row(jpeg_encoder *this)

{
  int local_20;
  int local_1c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  jpeg_encoder *this_local;
  
  if (this->m_num_components == '\x01') {
    for (i_2 = 0; i_2 < this->m_mcus_per_row; i_2 = i_2 + 1) {
      load_block_8_8_grey(this,i_2);
      code_block(this,0);
    }
  }
  else if ((this->m_comp_h_samp[0] == '\x01') && (this->m_comp_v_samp[0] == '\x01')) {
    for (i_3 = 0; i_3 < this->m_mcus_per_row; i_3 = i_3 + 1) {
      load_block_8_8(this,i_3,0,0);
      code_block(this,0);
      load_block_8_8(this,i_3,0,1);
      code_block(this,1);
      load_block_8_8(this,i_3,0,2);
      code_block(this,2);
    }
  }
  else if ((this->m_comp_h_samp[0] == '\x02') && (this->m_comp_v_samp[0] == '\x01')) {
    for (local_1c = 0; local_1c < this->m_mcus_per_row; local_1c = local_1c + 1) {
      load_block_8_8(this,local_1c << 1,0,0);
      code_block(this,0);
      load_block_8_8(this,local_1c * 2 + 1,0,0);
      code_block(this,0);
      load_block_16_8_8(this,local_1c,1);
      code_block(this,1);
      load_block_16_8_8(this,local_1c,2);
      code_block(this,2);
    }
  }
  else if ((this->m_comp_h_samp[0] == '\x02') && (this->m_comp_v_samp[0] == '\x02')) {
    for (local_20 = 0; local_20 < this->m_mcus_per_row; local_20 = local_20 + 1) {
      load_block_8_8(this,local_20 << 1,0,0);
      code_block(this,0);
      load_block_8_8(this,local_20 * 2 + 1,0,0);
      code_block(this,0);
      load_block_8_8(this,local_20 << 1,1,0);
      code_block(this,0);
      load_block_8_8(this,local_20 * 2 + 1,1,0);
      code_block(this,0);
      load_block_16_8(this,local_20,1);
      code_block(this,1);
      load_block_16_8(this,local_20,2);
      code_block(this,2);
    }
  }
  return;
}

Assistant:

void jpeg_encoder::process_mcu_row()
{
  if (m_num_components == 1)
  {
    for (int i = 0; i < m_mcus_per_row; i++)
    {
      load_block_8_8_grey(i); code_block(0);
    }
  }
  else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1))
  {
    for (int i = 0; i < m_mcus_per_row; i++)
    {
      load_block_8_8(i, 0, 0); code_block(0); load_block_8_8(i, 0, 1); code_block(1); load_block_8_8(i, 0, 2); code_block(2);
    }
  }
  else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1))
  {
    for (int i = 0; i < m_mcus_per_row; i++)
    {
      load_block_8_8(i * 2 + 0, 0, 0); code_block(0); load_block_8_8(i * 2 + 1, 0, 0); code_block(0);
      load_block_16_8_8(i, 1); code_block(1); load_block_16_8_8(i, 2); code_block(2);
    }
  }
  else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2))
  {
    for (int i = 0; i < m_mcus_per_row; i++)
    {
      load_block_8_8(i * 2 + 0, 0, 0); code_block(0); load_block_8_8(i * 2 + 1, 0, 0); code_block(0);
      load_block_8_8(i * 2 + 0, 1, 0); code_block(0); load_block_8_8(i * 2 + 1, 1, 0); code_block(0);
      load_block_16_8(i, 1); code_block(1); load_block_16_8(i, 2); code_block(2);
    }
  }
}